

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

bool __thiscall
google::anon_unknown_1::CommandLineFlag::Validate(CommandLineFlag *this,FlagValue *value)

{
  undefined1 uVar1;
  undefined1 in_CL;
  undefined8 *in_RDX;
  
  if (value != (FlagValue *)0x0) {
    switch(in_CL) {
    case 0:
      uVar1 = (*(code *)value)(this,*(undefined1 *)in_RDX);
      return (bool)uVar1;
    case 1:
    case 2:
      uVar1 = (*(code *)value)(this,*(undefined4 *)in_RDX);
      return (bool)uVar1;
    case 3:
    case 4:
      uVar1 = (*(code *)value)(this,*in_RDX);
      return (bool)uVar1;
    case 5:
      uVar1 = (*(code *)value)(*in_RDX);
      return (bool)uVar1;
    case 6:
      uVar1 = (*(code *)value)();
      return (bool)uVar1;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                    ,0x193,
                    "bool google::(anonymous namespace)::FlagValue::Validate(const char *, ValidateFnProto) const"
                   );
    }
  }
  return true;
}

Assistant:

bool CommandLineFlag::Validate(const FlagValue& value) const {

  if (validate_function() == NULL)
    return true;
  else
    return value.Validate(name(), validate_function());
}